

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O2

int archive_read_format_iso9660_read_header(archive_read *a,archive_entry *entry)

{
  int iVar1;
  iso9660 *iso9660;
  content *pcVar2;
  int iVar3;
  wchar_t wVar4;
  mode_t mVar5;
  int64_t iVar6;
  archive_string_conv *paVar7;
  uchar *puVar8;
  uchar *puVar9;
  int *piVar10;
  file_info *pfVar11;
  uint64_t uVar12;
  size_t n;
  bool bVar13;
  file_info *in_RCX;
  ulong reclen;
  char *pcVar14;
  long lVar15;
  char cVar16;
  file_info *file;
  
  iso9660 = (iso9660 *)a->format->data;
  if ((a->archive).archive_format == 0) {
    (a->archive).archive_format = 0x40000;
    (a->archive).archive_format_name = "ISO9660";
  }
  if (iso9660->current_position == 0) {
    if (iso9660->opt_support_joliet == 0) {
      iso9660->seenJoliet = '\0';
LAB_0030bf51:
      lVar15 = 0xbc;
      bVar13 = true;
    }
    else {
      if (iso9660->seenJoliet == '\0') goto LAB_0030bf51;
      iVar1 = (iso9660->primary).location;
      iVar3 = (iso9660->joliet).location;
      bVar13 = iVar1 <= iVar3;
      lVar15 = (ulong)(iVar3 < iVar1) * 8 + 0xbc;
    }
    uVar12 = __archive_read_consume(a,(long)*(int *)((long)&iso9660->magic + lVar15) << 0xb);
    if ((long)uVar12 < 0) {
LAB_0030c064:
      if ((int)uVar12 != 0) {
        return (int)uVar12;
      }
    }
    else {
      iso9660->current_position = uVar12;
      puVar8 = (uchar *)__archive_read_ahead
                                  (a,(ulong)*(uint *)((long)&iso9660->opt_support_joliet + lVar15),
                                   (ssize_t *)0x0);
      if (puVar8 == (uchar *)0x0) {
LAB_0030c072:
        pcVar14 = "Failed to read full block when scanning ISO9660 directory list";
        iVar3 = -1;
        goto LAB_0030c17a;
      }
      cVar16 = iso9660->seenJoliet;
      iso9660->seenJoliet = '\0';
      reclen = (ulong)*(uint *)((long)&iso9660->opt_support_joliet + lVar15);
      pfVar11 = parse_file_info(a,(file_info *)0x0,puVar8,reclen);
      if (pfVar11 == (file_info *)0x0) {
        return -0x1e;
      }
      iso9660->seenJoliet = cVar16;
      if (bVar13) {
        if (cVar16 == '\0' || iso9660->seenRockridge == '\0') {
          bVar13 = iso9660->seenRockridge != '\0' || cVar16 == '\0';
          in_RCX = (file_info *)CONCAT71((int7)(reclen >> 8),bVar13);
          if (bVar13) goto LAB_0030c1a1;
          uVar12 = __archive_read_consume
                             (a,(long)(iso9660->joliet).location * 0x800 - iso9660->current_position
                             );
          if ((long)uVar12 < 0) goto LAB_0030c064;
          iso9660->current_position = iso9660->current_position + uVar12;
          puVar8 = (uchar *)__archive_read_ahead(a,(ulong)(iso9660->joliet).size,(ssize_t *)0x0);
          if (puVar8 == (uchar *)0x0) goto LAB_0030c072;
          iso9660->seenJoliet = '\0';
          pfVar11 = parse_file_info(a,(file_info *)0x0,puVar8,(ulong)(iso9660->joliet).size);
          if (pfVar11 == (file_info *)0x0) {
            return -0x1e;
          }
        }
        else {
          cVar16 = '\0';
        }
        iso9660->seenJoliet = cVar16;
      }
LAB_0030c1a1:
      in_RCX = (file_info *)pfVar11->offset;
      iVar3 = heap_add_entry(a,&iso9660->pending_files,pfVar11,(uint64_t)in_RCX);
      if (iVar3 != 0) {
        return -0x1e;
      }
      if (iso9660->seenRockridge != '\0') {
        (a->archive).archive_format = 0x40001;
        (a->archive).archive_format_name = "ISO9660 with Rockridge extensions";
      }
    }
  }
  file = (file_info *)0x0;
  iVar3 = next_cache_entry(a,iso9660,&file);
  pfVar11 = file;
  if (iVar3 != 0) {
    return iVar3;
  }
  if (file->size == 0) {
    file->offset = iso9660->current_position;
  }
  if (iso9660->entry_bytes_unconsumed != 0) {
    __archive_read_consume(a,iso9660->entry_bytes_unconsumed);
    iso9660->entry_bytes_unconsumed = 0;
  }
  lVar15 = pfVar11->offset - iso9660->current_position;
  if (iso9660->current_position <= pfVar11->offset && lVar15 != 0) {
    iVar6 = __archive_read_consume(a,lVar15);
    if (iVar6 < 0) {
      if ((int)iVar6 != 0) {
        return (int)iVar6;
      }
    }
    else {
      iso9660->current_position = pfVar11->offset;
    }
  }
  if (iso9660->seenJoliet == '\0') {
    iVar3 = 0;
    pcVar14 = build_pathname(&iso9660->pathname,pfVar11,0);
    if (pcVar14 != (char *)0x0) {
      (iso9660->pathname).length = 0;
      archive_entry_set_pathname(entry,pcVar14);
      goto LAB_0030c0a6;
    }
  }
  else {
    if (iso9660->sconv_utf16be == (archive_string_conv *)0x0) {
      paVar7 = archive_string_conversion_from_charset(&a->archive,"UTF-16BE",L'\x01');
      iso9660->sconv_utf16be = paVar7;
      if (paVar7 == (archive_string_conv *)0x0) {
        return -0x1e;
      }
    }
    puVar8 = iso9660->utf16be_path;
    if (puVar8 == (uchar *)0x0) {
      puVar8 = (uchar *)malloc(0x400);
      iso9660->utf16be_path = puVar8;
      if (puVar8 != (uchar *)0x0) goto LAB_0030be91;
LAB_0030c171:
      pcVar14 = "No memory";
LAB_0030c178:
      iVar3 = 0xc;
      goto LAB_0030c17a;
    }
LAB_0030be91:
    if (iso9660->utf16be_previous_path == (uchar *)0x0) {
      puVar9 = (uchar *)malloc(0x400);
      iso9660->utf16be_previous_path = puVar9;
      if (puVar9 == (uchar *)0x0) goto LAB_0030c171;
    }
    iso9660->utf16be_path_len = 0;
    iVar3 = build_pathname_utf16be
                      (puVar8,(size_t)&iso9660->utf16be_path_len,(size_t *)pfVar11,in_RCX);
    if (iVar3 == 0) {
      wVar4 = _archive_entry_copy_pathname_l
                        (entry,(char *)iso9660->utf16be_path,iso9660->utf16be_path_len,
                         iso9660->sconv_utf16be);
      if (wVar4 == L'\0') {
        iVar3 = 0;
      }
      else {
        piVar10 = __errno_location();
        if (*piVar10 == 0xc) {
          pcVar14 = "No memory for Pathname";
          goto LAB_0030c178;
        }
        iVar3 = -0x14;
        pcVar14 = archive_string_conversion_charset_name(iso9660->sconv_utf16be);
        archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale."
                          ,pcVar14);
      }
LAB_0030c0a6:
      uVar12 = pfVar11->size;
      iso9660->entry_bytes_remaining = uVar12;
      iso9660->entry_sparse_offset = 0;
      if (iso9660->volume_size < uVar12 + pfVar11->offset) {
        pcVar14 = archive_entry_pathname(entry);
        archive_set_error(&a->archive,-1,"File is beyond end-of-media: %s",pcVar14);
LAB_0030c0e7:
        iso9660->entry_bytes_remaining = 0;
        return -0x14;
      }
      archive_entry_set_mode(entry,pfVar11->mode);
      archive_entry_set_uid(entry,(ulong)pfVar11->uid);
      archive_entry_set_gid(entry,(ulong)pfVar11->gid);
      archive_entry_set_nlink(entry,pfVar11->nlinks);
      if (pfVar11->birthtime_is_set == 0) {
        archive_entry_unset_birthtime(entry);
      }
      else {
        archive_entry_set_birthtime(entry,pfVar11->birthtime,0);
      }
      archive_entry_set_mtime(entry,pfVar11->mtime,0);
      archive_entry_set_ctime(entry,pfVar11->ctime,0);
      archive_entry_set_atime(entry,pfVar11->atime,0);
      archive_entry_set_rdev(entry,pfVar11->rdev);
      archive_entry_set_size(entry,iso9660->entry_bytes_remaining);
      pcVar14 = (pfVar11->symlink).s;
      if (pcVar14 != (char *)0x0) {
        archive_entry_copy_symlink(entry,pcVar14);
      }
      if ((pfVar11->number == -1) || (pfVar11->number != iso9660->previous_number)) {
        if (((pfVar11->mode & 0xf000) != 0x4000) && (pfVar11->offset < iso9660->current_position)) {
          uVar12 = __archive_read_seek(a,pfVar11->offset,0);
          if (uVar12 != pfVar11->offset) {
            archive_set_error(&a->archive,-1,"Ignoring out-of-order file @%jx (%s) %jd < %jd",
                              pfVar11->number,(iso9660->pathname).s,pfVar11->offset,
                              iso9660->current_position);
            goto LAB_0030c0e7;
          }
          iso9660->current_position = uVar12;
        }
        iVar1 = pfVar11->pz;
        (iso9660->entry_zisofs).pz = iVar1;
        if (iVar1 != 0) {
          (iso9660->entry_zisofs).initialized = 0;
          (iso9660->entry_zisofs).pz_log2_bs = pfVar11->pz_log2_bs;
          uVar12 = pfVar11->pz_uncompressed_size;
          (iso9660->entry_zisofs).pz_uncompressed_size = uVar12;
          (iso9660->entry_zisofs).pz_offset = 0;
          (iso9660->entry_zisofs).header_avail = 0;
          (iso9660->entry_zisofs).header_passed = 0;
          (iso9660->entry_zisofs).block_pointers_avail = 0;
          archive_entry_set_size(entry,uVar12);
        }
        iso9660->previous_number = pfVar11->number;
        if (iso9660->seenJoliet == '\0') {
          (iso9660->previous_pathname).length = 0;
          pcVar14 = (iso9660->pathname).s;
          if (pcVar14 == (char *)0x0) {
            n = 0;
          }
          else {
            n = strlen(pcVar14);
          }
          archive_strncat(&iso9660->previous_pathname,pcVar14,n);
        }
        else {
          memcpy(iso9660->utf16be_previous_path,iso9660->utf16be_path,iso9660->utf16be_path_len);
          iso9660->utf16be_previous_path_len = iso9660->utf16be_path_len;
        }
        pcVar2 = (pfVar11->contents).first;
        iso9660->entry_content = pcVar2;
        if (pcVar2 != (content *)0x0) {
          iso9660->entry_bytes_remaining = pcVar2->size;
        }
        mVar5 = archive_entry_filetype(entry);
        if (mVar5 != 0x4000) {
          return iVar3;
        }
        archive_entry_set_nlink(entry,pfVar11->subdirs + 2);
        goto LAB_0030c490;
      }
      if (iso9660->seenJoliet == '\0') {
        archive_entry_set_hardlink(entry,(iso9660->previous_pathname).s);
      }
      else {
        wVar4 = _archive_entry_copy_hardlink_l
                          (entry,(char *)iso9660->utf16be_previous_path,
                           iso9660->utf16be_previous_path_len,iso9660->sconv_utf16be);
        if (wVar4 != L'\0') {
          piVar10 = __errno_location();
          if (*piVar10 == 0xc) {
            pcVar14 = "No memory for Linkname";
            goto LAB_0030c178;
          }
          pcVar14 = archive_string_conversion_charset_name(iso9660->sconv_utf16be);
          archive_set_error(&a->archive,0x54,
                            "Linkname cannot be converted from %s to current locale.",pcVar14);
          iVar3 = -0x14;
        }
      }
      archive_entry_unset_size(entry);
LAB_0030c490:
      iso9660->entry_bytes_remaining = 0;
      return iVar3;
    }
  }
  pcVar14 = "Pathname is too long";
  iVar3 = 0x54;
LAB_0030c17a:
  archive_set_error(&a->archive,iVar3,pcVar14);
  return -0x1e;
}

Assistant:

static int
archive_read_format_iso9660_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct iso9660 *iso9660;
	struct file_info *file;
	int r, rd_r = ARCHIVE_OK;

	iso9660 = (struct iso9660 *)(a->format->data);

	if (!a->archive.archive_format) {
		a->archive.archive_format = ARCHIVE_FORMAT_ISO9660;
		a->archive.archive_format_name = "ISO9660";
	}

	if (iso9660->current_position == 0) {
		r = choose_volume(a, iso9660);
		if (r != ARCHIVE_OK)
			return (r);
	}

	file = NULL;/* Eliminate a warning. */
	/* Get the next entry that appears after the current offset. */
	r = next_entry_seek(a, iso9660, &file);
	if (r != ARCHIVE_OK)
		return (r);

	if (iso9660->seenJoliet) {
		/*
		 * Convert UTF-16BE of a filename to local locale MBS
		 * and store the result into a filename field.
		 */
		if (iso9660->sconv_utf16be == NULL) {
			iso9660->sconv_utf16be =
			    archive_string_conversion_from_charset(
				&(a->archive), "UTF-16BE", 1);
			if (iso9660->sconv_utf16be == NULL)
				/* Couldn't allocate memory */
				return (ARCHIVE_FATAL);
		}
		if (iso9660->utf16be_path == NULL) {
			iso9660->utf16be_path = malloc(UTF16_NAME_MAX);
			if (iso9660->utf16be_path == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
		}
		if (iso9660->utf16be_previous_path == NULL) {
			iso9660->utf16be_previous_path = malloc(UTF16_NAME_MAX);
			if (iso9660->utf16be_previous_path == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
		}

		iso9660->utf16be_path_len = 0;
		if (build_pathname_utf16be(iso9660->utf16be_path,
		    UTF16_NAME_MAX, &(iso9660->utf16be_path_len), file) != 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Pathname is too long");
			return (ARCHIVE_FATAL);
		}

		r = archive_entry_copy_pathname_l(entry,
		    (const char *)iso9660->utf16be_path,
		    iso9660->utf16be_path_len,
		    iso9660->sconv_utf16be);
		if (r != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for Pathname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Pathname cannot be converted "
			    "from %s to current locale.",
			    archive_string_conversion_charset_name(
			      iso9660->sconv_utf16be));

			rd_r = ARCHIVE_WARN;
		}
	} else {
		const char *path = build_pathname(&iso9660->pathname, file, 0);
		if (path == NULL) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Pathname is too long");
			return (ARCHIVE_FATAL);
		} else {
			archive_string_empty(&iso9660->pathname);
			archive_entry_set_pathname(entry, path);
		}
	}

	iso9660->entry_bytes_remaining = file->size;
	/* Offset for sparse-file-aware clients. */
	iso9660->entry_sparse_offset = 0;

	if (file->offset + file->size > iso9660->volume_size) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "File is beyond end-of-media: %s",
		    archive_entry_pathname(entry));
		iso9660->entry_bytes_remaining = 0;
		return (ARCHIVE_WARN);
	}

	/* Set up the entry structure with information about this entry. */
	archive_entry_set_mode(entry, file->mode);
	archive_entry_set_uid(entry, file->uid);
	archive_entry_set_gid(entry, file->gid);
	archive_entry_set_nlink(entry, file->nlinks);
	if (file->birthtime_is_set)
		archive_entry_set_birthtime(entry, file->birthtime, 0);
	else
		archive_entry_unset_birthtime(entry);
	archive_entry_set_mtime(entry, file->mtime, 0);
	archive_entry_set_ctime(entry, file->ctime, 0);
	archive_entry_set_atime(entry, file->atime, 0);
	/* N.B.: Rock Ridge supports 64-bit device numbers. */
	archive_entry_set_rdev(entry, (dev_t)file->rdev);
	archive_entry_set_size(entry, iso9660->entry_bytes_remaining);
	if (file->symlink.s != NULL)
		archive_entry_copy_symlink(entry, file->symlink.s);

	/* Note: If the input isn't seekable, we can't rewind to
	 * return the same body again, so if the next entry refers to
	 * the same data, we have to return it as a hardlink to the
	 * original entry. */
	if (file->number != -1 &&
	    file->number == iso9660->previous_number) {
		if (iso9660->seenJoliet) {
			r = archive_entry_copy_hardlink_l(entry,
			    (const char *)iso9660->utf16be_previous_path,
			    iso9660->utf16be_previous_path_len,
			    iso9660->sconv_utf16be);
			if (r != 0) {
				if (errno == ENOMEM) {
					archive_set_error(&a->archive, ENOMEM,
					    "No memory for Linkname");
					return (ARCHIVE_FATAL);
				}
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Linkname cannot be converted "
				    "from %s to current locale.",
				    archive_string_conversion_charset_name(
				      iso9660->sconv_utf16be));
				rd_r = ARCHIVE_WARN;
			}
		} else
			archive_entry_set_hardlink(entry,
			    iso9660->previous_pathname.s);
		archive_entry_unset_size(entry);
		iso9660->entry_bytes_remaining = 0;
		return (rd_r);
	}

	if ((file->mode & AE_IFMT) != AE_IFDIR &&
	    file->offset < iso9660->current_position) {
		int64_t r64;

		r64 = __archive_read_seek(a, file->offset, SEEK_SET);
		if (r64 != (int64_t)file->offset) {
			/* We can't seek backwards to extract it, so issue
			 * a warning.  Note that this can only happen if
			 * this entry was added to the heap after we passed
			 * this offset, that is, only if the directory
			 * mentioning this entry is later than the body of
			 * the entry. Such layouts are very unusual; most
			 * ISO9660 writers lay out and record all directory
			 * information first, then store all file bodies. */
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Ignoring out-of-order file @%jx (%s) %jd < %jd",
			    (intmax_t)file->number,
			    iso9660->pathname.s,
			    (intmax_t)file->offset,
			    (intmax_t)iso9660->current_position);
			iso9660->entry_bytes_remaining = 0;
			return (ARCHIVE_WARN);
		}
		iso9660->current_position = (uint64_t)r64;
	}

	/* Initialize zisofs variables. */
	iso9660->entry_zisofs.pz = file->pz;
	if (file->pz) {
#ifdef HAVE_ZLIB_H
		struct zisofs  *zisofs;

		zisofs = &iso9660->entry_zisofs;
		zisofs->initialized = 0;
		zisofs->pz_log2_bs = file->pz_log2_bs;
		zisofs->pz_uncompressed_size = file->pz_uncompressed_size;
		zisofs->pz_offset = 0;
		zisofs->header_avail = 0;
		zisofs->header_passed = 0;
		zisofs->block_pointers_avail = 0;
#endif
		archive_entry_set_size(entry, file->pz_uncompressed_size);
	}

	iso9660->previous_number = file->number;
	if (iso9660->seenJoliet) {
		memcpy(iso9660->utf16be_previous_path, iso9660->utf16be_path,
		    iso9660->utf16be_path_len);
		iso9660->utf16be_previous_path_len = iso9660->utf16be_path_len;
	} else
		archive_strcpy(
		    &iso9660->previous_pathname, iso9660->pathname.s);

	/* Reset entry_bytes_remaining if the file is multi extent. */
	iso9660->entry_content = file->contents.first;
	if (iso9660->entry_content != NULL)
		iso9660->entry_bytes_remaining = iso9660->entry_content->size;

	if (archive_entry_filetype(entry) == AE_IFDIR) {
		/* Overwrite nlinks by proper link number which is
		 * calculated from number of sub directories. */
		archive_entry_set_nlink(entry, 2 + file->subdirs);
		/* Directory data has been read completely. */
		iso9660->entry_bytes_remaining = 0;
	}

	if (rd_r != ARCHIVE_OK)
		return (rd_r);
	return (ARCHIVE_OK);
}